

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexReader::MetaData::getValue(MetaData *this,int index,char **value)

{
  Entry *pEVar1;
  char *pcVar2;
  
  if ((-1 < index) &&
     (index < (int)((ulong)((long)(this->_entries).
                                  super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_entries).
                                 super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
    pEVar1 = getEntry(this,index);
    if ((pEVar1 != (Entry *)0x0) && (pEVar1->type == mdt_string)) {
      pcVar2 = pEVar1->data;
      goto LAB_0039d0d2;
    }
  }
  pcVar2 = (char *)0x0;
LAB_0039d0d2:
  *value = pcVar2;
  return;
}

Assistant:

virtual void getValue(int index, const char*& value)
	{
	    if (index < 0 || index >= int(_entries.size())) { value = 0; return; }
	    Entry* e = getEntry(index);
	    if (e && e->type == mdt_string) value = (const char*) e->data;
	    else value = 0;
	}